

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

ParseLocation * __thiscall embree::StdStream::location(StdStream *this)

{
  ssize_t in_RSI;
  ParseLocation *in_RDI;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  ParseLocation *lineNumber;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fileName;
  ParseLocation *in_stack_ffffffffffffffd0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20 [2];
  
  fileName = local_20;
  lineNumber = in_RDI;
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr(&in_RDI->fileName,in_stack_ffffffffffffffa8);
  ParseLocation::ParseLocation
            (in_stack_ffffffffffffffd0,fileName,(ssize_t)lineNumber,in_RSI,(ssize_t)in_RDI);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x41b7c4);
  return in_RDI;
}

Assistant:

ParseLocation location() {
      return ParseLocation(name,lineNumber,colNumber,charNumber);
    }